

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

size_t Output::VPrint(char16 *form,__va_list_tag *argptr)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  char16_t local_1018 [4];
  char16 buf [2048];
  
  iVar1 = _vsnwprintf(local_1018,0x800,form,argptr);
  buf[0x7fb] = L'\0';
  if (iVar1 < 0) {
    piVar3 = PAL_errno(0);
    if (*piVar3 == 0) {
      piVar3 = PAL_errno(0);
      *piVar3 = 0x22;
    }
  }
  iVar2 = 0x7ff;
  if (iVar1 != -1) {
    iVar2 = iVar1;
  }
  sVar4 = PrintBuffer(local_1018,(long)iVar2);
  return sVar4;
}

Assistant:

size_t __cdecl
Output::VPrint(const char16 *form, va_list argptr)
{
    char16 buf[2048];
    size_t size;

    size = _vsnwprintf_s(buf, _countof(buf), _TRUNCATE, form, argptr);
    if(size == -1)
    {
        size = _countof(buf) - 1;  // characters written, excluding the terminating null
    }
    return Output::PrintBuffer(buf, size);
}